

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O0

bool __thiscall xray_re::xr_ogf_v3::hierarchical(xr_ogf_v3 *this)

{
  ogf_model_type oVar1;
  xr_ogf_v3 *this_local;
  
  oVar1 = (this->super_xr_ogf).m_model_type;
  if ((((oVar1 == MT3_HIERRARHY) || (oVar1 == MT3_SKELETON_ANIM)) || (oVar1 == MT3_LOD)) ||
     (oVar1 == MT3_SKELETON_RIGID)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool xr_ogf_v3::hierarchical() const
{
	switch (m_model_type) {
	case MT3_HIERRARHY:
	case MT3_SKELETON_ANIM:
	case MT3_SKELETON_RIGID:
	case MT3_LOD:
		return true;
	default:
		return false;
	}
}